

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorhulls.cpp
# Opt level: O1

void VHRotateV(double *px,double *py,double ox,double oy,double theta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = *px;
  dVar2 = *py;
  dVar3 = cos(theta);
  dVar4 = sin(theta);
  dVar5 = sin(theta);
  dVar6 = cos(theta);
  *px = (dVar3 * (dVar1 - ox) - dVar4 * (dVar2 - oy)) + ox;
  *py = dVar5 * (dVar1 - ox) + dVar6 * (dVar2 - oy) + oy;
  return;
}

Assistant:

void VHRotateV(double *px, double *py, double ox, double oy, double theta) {
	double tx, ty, ttx, tty;

	tx = *px - ox;
	ty = *py - oy;

	// With not a lot of parts on the boards, we can get away with using the
	// precision trig functions, might have to change to LUT based later.
	ttx = tx * cos(theta) - ty * sin(theta);
	tty = tx * sin(theta) + ty * cos(theta);

	*px = ttx + ox;
	*py = tty + oy;
}